

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void checker(void)

{
  bool bVar1;
  bool local_1ae;
  bool local_1ab;
  undefined1 local_1a0 [28];
  int v_8;
  int re_sizeP;
  undefined1 local_170 [24];
  int v_7;
  int re_sizeC;
  int local_148;
  int local_144;
  int u_6;
  int _p__6;
  int re_neiP;
  int v_6;
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  int u_5;
  int _p__5;
  int re_neiC;
  int v_5;
  int local_e8;
  int local_e4;
  int u_4;
  int _p__4;
  int local_d0;
  int local_cc;
  int v_4;
  int re_CE_Cm_Cm;
  int local_b8;
  int local_b4;
  int u_3;
  int _p__3;
  int local_a0;
  int local_9c;
  int v_3;
  int re_CE_Cm_Cp;
  int local_88;
  int local_84;
  int u_2;
  int _p__2;
  int local_70;
  int local_6c;
  int v_2;
  int re_CE_Cp_Cp;
  int local_58;
  int local_54;
  int u_1;
  int _p__1;
  int local_40;
  int local_3c;
  int v_1;
  int re_CE_Cp_P;
  int local_28;
  int local_24;
  int u;
  int _p_;
  int local_10;
  int local_c;
  int v;
  int re_CE_P_P;
  
  local_c = 0;
  for (local_10 = 0; local_10 < size; local_10 = local_10 + 1) {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)&u,0x52b8320);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&u);
    std::bitset<15000UL>::reference::~reference((reference *)&u);
    if (bVar1) {
      local_24 = NAdjP[local_10];
      local_28 = NAdjB[local_24];
      while (local_24 < NAdjP[local_10 + 1]) {
        std::bitset<15000UL>::operator[]((bitset<15000UL> *)&v_1,0x52b8320);
        bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&v_1);
        std::bitset<15000UL>::reference::~reference((reference *)&v_1);
        if (bVar1) {
          local_c = local_c + 1;
        }
        local_24 = local_24 + 1;
        local_28 = NAdjB[local_24];
      }
    }
  }
  local_c = local_c >> 1;
  if (local_c != CE_P_P) {
    __assert_fail("re_CE_P_P == CE_P_P",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x13b,"void checker()");
  }
  local_3c = 0;
  for (local_40 = 0; local_40 < size; local_40 = local_40 + 1) {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)&u_1,0x52b91d0);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&u_1);
    std::bitset<15000UL>::reference::~reference((reference *)&u_1);
    if (bVar1) {
      local_54 = NAdjP[local_40];
      local_58 = NAdjB[local_54];
      while (local_54 < NAdjP[local_40 + 1]) {
        std::bitset<15000UL>::operator[]((bitset<15000UL> *)&v_2,0x52b8320);
        bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&v_2);
        std::bitset<15000UL>::reference::~reference((reference *)&v_2);
        if (bVar1) {
          local_3c = local_3c + 1;
        }
        local_54 = local_54 + 1;
        local_58 = NAdjB[local_54];
      }
    }
  }
  if (local_3c != CE_Cp_P) {
    __assert_fail("re_CE_Cp_P == CE_Cp_P",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x141,"void checker()");
  }
  local_6c = 0;
  for (local_70 = 0; local_70 < size; local_70 = local_70 + 1) {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)&u_2,0x52b91d0);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&u_2);
    std::bitset<15000UL>::reference::~reference((reference *)&u_2);
    if (bVar1) {
      local_84 = NAdjP[local_70];
      local_88 = NAdjB[local_84];
      while (local_84 < NAdjP[local_70 + 1]) {
        std::bitset<15000UL>::operator[]((bitset<15000UL> *)&v_3,0x52b91d0);
        bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&v_3);
        std::bitset<15000UL>::reference::~reference((reference *)&v_3);
        if (bVar1) {
          local_6c = local_6c + 1;
        }
        local_84 = local_84 + 1;
        local_88 = NAdjB[local_84];
      }
    }
  }
  local_6c = local_6c >> 1;
  if (local_6c != CE_Cp_Cp) {
    __assert_fail("re_CE_Cp_Cp == CE_Cp_Cp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x148,"void checker()");
  }
  local_9c = 0;
  for (local_a0 = 0; local_a0 < size; local_a0 = local_a0 + 1) {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)&u_3,0x52b8a78);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&u_3);
    std::bitset<15000UL>::reference::~reference((reference *)&u_3);
    if (bVar1) {
      local_b4 = NAdjP[local_a0];
      local_b8 = NAdjB[local_b4];
      while (local_b4 < NAdjP[local_a0 + 1]) {
        std::bitset<15000UL>::operator[]((bitset<15000UL> *)&v_4,0x52b91d0);
        bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&v_4);
        std::bitset<15000UL>::reference::~reference((reference *)&v_4);
        if (bVar1) {
          local_9c = local_9c + 1;
        }
        local_b4 = local_b4 + 1;
        local_b8 = NAdjB[local_b4];
      }
    }
  }
  if (local_9c != CE_Cm_Cp) {
    __assert_fail("re_CE_Cm_Cp == CE_Cm_Cp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x14e,"void checker()");
  }
  local_cc = 0;
  for (local_d0 = 0; local_d0 < size; local_d0 = local_d0 + 1) {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)&u_4,0x52b8a78);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&u_4);
    std::bitset<15000UL>::reference::~reference((reference *)&u_4);
    if (bVar1) {
      local_e4 = NAdjP[local_d0];
      local_e8 = NAdjB[local_e4];
      while (local_e4 < NAdjP[local_d0 + 1]) {
        std::bitset<15000UL>::operator[]((bitset<15000UL> *)&re_neiC,0x52b8a78);
        bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&re_neiC);
        std::bitset<15000UL>::reference::~reference((reference *)&re_neiC);
        if (bVar1) {
          local_cc = local_cc + 1;
        }
        local_e4 = local_e4 + 1;
        local_e8 = NAdjB[local_e4];
      }
    }
  }
  local_cc = local_cc >> 1;
  if (local_cc != CE_Cm_Cm) {
    __assert_fail("re_CE_Cm_Cm == CE_Cm_Cm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x155,"void checker()");
  }
  for (_p__5 = 0; _p__5 < size; _p__5 = _p__5 + 1) {
    u_5 = 0;
    local_118._20_4_ = AdjP[_p__5];
    local_118._16_4_ = AdjB[(int)local_118._20_4_];
    while ((int)local_118._20_4_ < AdjP[_p__5 + 1]) {
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_118,0x52b91d0);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_118);
      re_neiP._3_1_ = 0;
      local_1ab = true;
      if (!bVar1) {
        std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_128,0x52b8a78);
        re_neiP._3_1_ = 1;
        local_1ab = std::bitset::reference::operator_cast_to_bool((reference *)local_128);
      }
      if ((re_neiP._3_1_ & 1) != 0) {
        std::bitset<15000UL>::reference::~reference((reference *)local_128);
      }
      std::bitset<15000UL>::reference::~reference((reference *)local_118);
      if (local_1ab != false) {
        u_5 = u_5 + 1;
      }
      local_118._20_4_ = local_118._20_4_ + 1;
      local_118._16_4_ = AdjB[(int)local_118._20_4_];
    }
    if (u_5 != neiC[_p__5]) {
      __assert_fail("re_neiC == neiC[v]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x15b,"void checker()");
    }
  }
  for (_p__6 = 0; _p__6 < size; _p__6 = _p__6 + 1) {
    u_6 = 0;
    local_144 = AdjP[_p__6];
    local_148 = AdjB[local_144];
    while (local_144 < AdjP[_p__6 + 1]) {
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)&v_7,0x52b8320);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&v_7);
      std::bitset<15000UL>::reference::~reference((reference *)&v_7);
      if (bVar1) {
        u_6 = u_6 + 1;
      }
      local_144 = local_144 + 1;
      local_148 = AdjB[local_144];
    }
    if (u_6 != neiP[_p__6]) {
      __assert_fail("re_neiP == neiP[v]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x162,"void checker()");
    }
  }
  local_170._20_4_ = 0;
  for (local_170._16_4_ = 0; (int)local_170._16_4_ < size; local_170._16_4_ = local_170._16_4_ + 1)
  {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_170,0x52b8a78);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_170);
    v_8._3_1_ = 0;
    local_1ae = true;
    if (!bVar1) {
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)&re_sizeP,0x52b91d0);
      v_8._3_1_ = 1;
      local_1ae = std::bitset::reference::operator_cast_to_bool((reference *)&re_sizeP);
    }
    if ((v_8._3_1_ & 1) != 0) {
      std::bitset<15000UL>::reference::~reference((reference *)&re_sizeP);
    }
    std::bitset<15000UL>::reference::~reference((reference *)local_170);
    if (local_1ae != false) {
      local_170._20_4_ = local_170._20_4_ + 1;
    }
  }
  if (local_170._20_4_ != sizeC) {
    __assert_fail("re_sizeC == sizeC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x168,"void checker()");
  }
  local_1a0._24_4_ = 0;
  for (local_1a0._20_4_ = 0; (int)local_1a0._20_4_ < size; local_1a0._20_4_ = local_1a0._20_4_ + 1)
  {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_1a0,0x52b8320);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_1a0);
    std::bitset<15000UL>::reference::~reference((reference *)local_1a0);
    if (bVar1) {
      local_1a0._24_4_ = local_1a0._24_4_ + 1;
    }
  }
  if (local_1a0._24_4_ != sizeP) {
    __assert_fail("re_sizeP == sizeP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x16d,"void checker()");
  }
  return;
}

Assistant:

void checker() {
    /* CE_P_P */
    int re_CE_P_P = 0;
    for (int v = 0; v < size; ++v) if (P[v])
        FOR_C_NP(v, u) re_CE_P_P += 1;
    re_CE_P_P >>= 1;
    assert(re_CE_P_P == CE_P_P);

    /* CE_Cp_P */
    int re_CE_Cp_P = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NP(v, u) re_CE_Cp_P += 1;
    assert(re_CE_Cp_P == CE_Cp_P);

    /* CE_Cp_Cp */
    int re_CE_Cp_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cp_Cp;
    re_CE_Cp_Cp >>= 1;
    assert(re_CE_Cp_Cp == CE_Cp_Cp);

    /* CE_Cm_Cp */
    int re_CE_Cm_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cm_Cp;
    assert(re_CE_Cm_Cp == CE_Cm_Cp);

    /* CE_Cm_Cm */
    int re_CE_Cm_Cm = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cm[u]) ++re_CE_Cm_Cm;
    re_CE_Cm_Cm >>= 1;
    assert(re_CE_Cm_Cm == CE_Cm_Cm);

    /* neiC */
    for (int v = 0; v < size; ++v) {
        int re_neiC = 0;
        FOR_NC(v, u) re_neiC += 1;
        assert(re_neiC == neiC[v]);
    }

    /* neiP */
    for (int v = 0; v < size; ++v) {
        int re_neiP = 0;
        FOR_NP(v, u) re_neiP += 1;
        assert(re_neiP == neiP[v]);
    }

    /* sizeC */
    int re_sizeC = 0;
    for (int v = 0; v < size; ++v) if(Cm[v] || Cp[v]) ++re_sizeC;
    assert(re_sizeC == sizeC);

    /* sizeP */
    int re_sizeP = 0;
    for (int v = 0; v < size; ++v) if (P[v]) ++re_sizeP;
    assert(re_sizeP == sizeP);
}